

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

Timestamp * google::protobuf::operator+=(Timestamp *t,Duration *d)

{
  Timestamp local_38;
  
  util::anon_unknown_1::CreateNormalized<google::protobuf::Timestamp>
            (&local_38,d->seconds_ + t->seconds_,(long)d->nanos_ + (long)t->nanos_);
  Timestamp::operator=(t,&local_38);
  Timestamp::~Timestamp(&local_38);
  return t;
}

Assistant:

Timestamp& operator+=(Timestamp& t, const Duration& d) {  // NOLINT
  t = CreateNormalized<Timestamp>(t.seconds() + d.seconds(),
                                  t.nanos() + d.nanos());
  return t;
}